

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sections.cpp
# Opt level: O0

bool ast::Sections::address_is_free(Section *s)

{
  bool bVar1;
  reference ppSVar2;
  const_iterator local_38;
  Section *local_30;
  Section *r;
  _Self local_20;
  iterator iter;
  Section *s_local;
  
  iter._M_node = (_List_node_base *)s;
  local_20._M_node =
       (_List_node_base *)
       std::__cxx11::list<ast::Section_*,_std::allocator<ast::Section_*>_>::begin
                 ((list<ast::Section_*,_std::allocator<ast::Section_*>_> *)list_abi_cxx11_);
  while( true ) {
    r = (Section *)
        std::__cxx11::list<ast::Section_*,_std::allocator<ast::Section_*>_>::end
                  ((list<ast::Section_*,_std::allocator<ast::Section_*>_> *)list_abi_cxx11_);
    bVar1 = std::operator!=(&local_20,(_Self *)&r);
    if (!bVar1) break;
    ppSVar2 = std::_List_iterator<ast::Section_*>::operator*(&local_20);
    local_30 = *ppSVar2;
    if ((local_30->base_address <
         (uint)(*(int *)((long)&iter._M_node[2]._M_next + 4) + *(int *)&iter._M_node[3]._M_next)) &&
       (*(uint *)((long)&iter._M_node[2]._M_next + 4) <
        local_30->base_address + local_30->content_size)) {
      return false;
    }
    if ((uint)(*(int *)((long)&iter._M_node[2]._M_next + 4) + *(int *)&iter._M_node[3]._M_next) <=
        local_30->base_address) break;
    std::_List_iterator<ast::Section_*>::operator++(&local_20);
  }
  std::_List_const_iterator<ast::Section_*>::_List_const_iterator(&local_38,&local_20);
  std::__cxx11::list<ast::Section_*,_std::allocator<ast::Section_*>_>::insert
            ((list<ast::Section_*,_std::allocator<ast::Section_*>_> *)list_abi_cxx11_,local_38,
             (value_type *)&iter);
  return true;
}

Assistant:

bool Sections::address_is_free(Section *s)
{
	auto iter = list.begin();
	for (; iter != list.end(); ++iter) {
		Section *r = *iter;
		if (s->base_address + s->content_size > r->base_address
				&& r->base_address + r->content_size > s->base_address)
			return false;
		if (s->base_address + s->content_size <= r->base_address)
			break;
	}
	list.insert(iter, s);
	return true;
}